

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::resize_uninitialized
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  size_type sVar2;
  size_t sVar3;
  uint in_ESI;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  size_type in_stack_00000014;
  iterator in_stack_00000018;
  iterator in_stack_00000020;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffd0;
  difference_type_conflict pos;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffd8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffff0;
  
  pos = (difference_type_conflict)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = capacity((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (sVar3 < in_ESI) {
    change_capacity((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_00000018.ptr,
                    in_stack_00000014);
    sVar2 = size(in_RDI);
    in_RDI->_size = (in_ESI - sVar2) + in_RDI->_size;
  }
  else {
    uVar4 = in_ESI;
    sVar2 = size(in_RDI);
    if (uVar4 < sVar2) {
      item_ptr(in_stack_ffffffffffffffd8,pos);
      iterator::iterator((iterator *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (uchar *)0x3350f6);
      end((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
          CONCAT44(in_stack_ffffffffffffffc4,uVar4));
      erase(in_stack_fffffffffffffff0,in_stack_00000020,in_stack_00000018);
    }
    else {
      sVar2 = size(in_RDI);
      in_RDI->_size = (in_ESI - sVar2) + in_RDI->_size;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void resize_uninitialized(size_type new_size) {
        // resize_uninitialized changes the size of the prevector but does not initialize it.
        // If size < new_size, the added elements must be initialized explicitly.
        if (capacity() < new_size) {
            change_capacity(new_size);
            _size += new_size - size();
            return;
        }
        if (new_size < size()) {
            erase(item_ptr(new_size), end());
        } else {
            _size += new_size - size();
        }
    }